

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3WithDelete(sqlite3 *db,With *pWith)

{
  long lVar1;
  Select **ppSVar2;
  
  if (pWith != (With *)0x0) {
    ppSVar2 = &pWith->a[0].pSelect;
    for (lVar1 = 0; lVar1 < pWith->nCte; lVar1 = lVar1 + 1) {
      sqlite3ExprListDelete(db,(ExprList *)ppSVar2[-1]);
      sqlite3SelectDelete(db,*ppSVar2);
      sqlite3DbFree(db,((Cte *)(ppSVar2 + -2))->zName);
      ppSVar2 = ppSVar2 + 4;
    }
    sqlite3DbFreeNN(db,pWith);
    return;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3WithDelete(sqlite3 *db, With *pWith){
  if( pWith ){
    int i;
    for(i=0; i<pWith->nCte; i++){
      struct Cte *pCte = &pWith->a[i];
      sqlite3ExprListDelete(db, pCte->pCols);
      sqlite3SelectDelete(db, pCte->pSelect);
      sqlite3DbFree(db, pCte->zName);
    }
    sqlite3DbFree(db, pWith);
  }
}